

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuconnection.cpp
# Opt level: O1

bool __thiscall
QDBusMenuConnection::registerTrayIconWithWatcher(QDBusMenuConnection *this,QDBusTrayIcon *item)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QDBusMessage registerMethod;
  QString local_90;
  QArrayDataPointer<QVariant> local_78;
  undefined1 local_60 [8];
  QVariant local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QVar2.m_data = (storage_type *)0x1a;
  QVar2.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar2);
  local_78.d = (Data *)local_58.d.data.shared;
  local_78.ptr = (QVariant *)local_58.d.data._8_8_;
  local_78.size = local_58.d.data._16_8_;
  QDBusMessage::createMethodCall
            ((QString *)local_60,&StatusNotifierWatcherService,&StatusNotifierWatcherPath,
             &StatusNotifierWatcherService);
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
    }
  }
  local_78.d = (Data *)0x0;
  local_78.ptr = (QVariant *)0x0;
  local_78.size = 0;
  QDBusConnection::baseService();
  ::QVariant::QVariant(&local_58,&local_90);
  QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
            ((QMovableArrayOps<QVariant> *)&local_78,local_78.size,&local_58);
  QList<QVariant>::end((QList<QVariant> *)&local_78);
  QDBusMessage::setArguments((QList_conflict *)local_60);
  ::QVariant::~QVariant(&local_58);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_78);
  uVar1 = QDBusConnection::callWithCallback
                    ((QDBusMessage *)(this + 0x28),(QObject *)local_60,(char *)this,
                     "2trayIconRegistered()",0x6da49f);
  QDBusMessage::~QDBusMessage((QDBusMessage *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDBusMenuConnection::registerTrayIconWithWatcher(QDBusTrayIcon *item)
{
    Q_UNUSED(item);
    QDBusMessage registerMethod = QDBusMessage::createMethodCall(
                StatusNotifierWatcherService, StatusNotifierWatcherPath, StatusNotifierWatcherService,
                "RegisterStatusNotifierItem"_L1);
    registerMethod.setArguments(QVariantList() << m_connection.baseService());
    return m_connection.callWithCallback(registerMethod, this, SIGNAL(trayIconRegistered()), SLOT(dbusError(QDBusError)));
}